

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int doautoexplore(void)

{
  int iVar1;
  
  iflags.autoexplore = '\x01';
  flags.travel = '\x01';
  iflags.travel1 = '\x01';
  flags.run = 8;
  flags.nopick = '\0';
  if (multi == 0) {
    multi = 0x50;
  }
  u.last_str_turn = 0;
  flags.mv = '\x01';
  iVar1 = domove('\0','\0','\0');
  return iVar1;
}

Assistant:

static int doautoexplore(void)
{
	iflags.autoexplore = TRUE;
	flags.travel = 1;
	iflags.travel1 = 1;
	flags.run = 8;
	flags.nopick = FALSE;
	if (!multi)
	    multi = max(COLNO,ROWNO);
	u.last_str_turn = 0;
	flags.mv = TRUE;

	return domove(0, 0, 0);
}